

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void sqlite3StartTable(Parse *pParse,Token *pName1,Token *pName2,int isTemp,int isView,int isVirtual
                      ,int noErr)

{
  sqlite3 *db;
  Schema *pSVar1;
  uint uVar2;
  undefined4 uVar3;
  uint iDb;
  int iVar4;
  int iVar5;
  int iVar6;
  Token *zName;
  RenameToken *pRVar7;
  Table *pTVar8;
  Vdbe *p;
  Index *pIVar9;
  int iVar10;
  Op *pOVar11;
  char *zArg1;
  Token *pTVar12;
  char *pcVar13;
  int iVar14;
  bool bVar15;
  Token *pName;
  Token *local_38;
  
  db = pParse->db;
  if (((db->init).busy == '\0') || ((db->init).newTnum != 1)) {
    iDb = sqlite3TwoPartName(pParse,pName1,pName2,&local_38);
    pTVar12 = local_38;
    if ((int)iDb < 0) {
      return;
    }
    if (((isTemp != 0) && (bVar15 = iDb != 1, iDb = 1, bVar15)) && (pName2->n != 0)) {
      sqlite3ErrorMsg(pParse,"temporary table name must be unqualified");
      return;
    }
    zName = (Token *)sqlite3NameFromToken(db,local_38);
    if ((1 < pParse->eParseMode) &&
       (pRVar7 = (RenameToken *)sqlite3DbMallocZero(pParse->db,0x20), pRVar7 != (RenameToken *)0x0))
    {
      pRVar7->p = zName;
      uVar2 = pTVar12->n;
      uVar3 = *(undefined4 *)&pTVar12->field_0xc;
      (pRVar7->t).z = pTVar12->z;
      (pRVar7->t).n = uVar2;
      *(undefined4 *)&(pRVar7->t).field_0xc = uVar3;
      pRVar7->pNext = pParse->pRename;
      pParse->pRename = pRVar7;
    }
  }
  else {
    iDb = (uint)(db->init).iDb;
    pcVar13 = "sqlite_master";
    if (iDb == 1) {
      pcVar13 = "sqlite_temp_master";
    }
    zName = (Token *)sqlite3DbStrDup(db,pcVar13);
    local_38 = pName1;
  }
  pTVar12 = local_38;
  uVar2 = local_38->n;
  uVar3 = *(undefined4 *)&local_38->field_0xc;
  (pParse->sNameToken).z = local_38->z;
  (pParse->sNameToken).n = uVar2;
  *(undefined4 *)&(pParse->sNameToken).field_0xc = uVar3;
  if (zName == (Token *)0x0) {
    return;
  }
  iVar4 = sqlite3CheckObjectName(pParse,(char *)zName);
  if (iVar4 != 0) goto LAB_00167245;
  if ((db->init).iDb == '\x01') {
    isTemp = 1;
  }
  pcVar13 = db->aDb[iDb].zDbSName;
  zArg1 = "sqlite_master";
  if (isTemp == 1) {
    zArg1 = "sqlite_temp_master";
  }
  iVar4 = sqlite3AuthCheck(pParse,0x12,zArg1,(char *)0x0,pcVar13);
  if ((iVar4 != 0) ||
     ((isVirtual == 0 &&
      (iVar4 = sqlite3AuthCheck(pParse,(uint)"\x02\x04\b\x06"[(long)isTemp + (long)isView * 2],
                                (char *)zName,(char *)0x0,pcVar13), iVar4 != 0))))
  goto LAB_00167245;
  if (pParse->eParseMode == '\0') {
    pcVar13 = db->aDb[iDb].zDbSName;
    iVar4 = sqlite3ReadSchema(pParse);
    if (iVar4 != 0) goto LAB_00167245;
    pTVar8 = sqlite3FindTable(db,(char *)zName,pcVar13);
    if (pTVar8 == (Table *)0x0) {
      pIVar9 = sqlite3FindIndex(db,(char *)zName,pcVar13);
      if (pIVar9 == (Index *)0x0) goto LAB_00167276;
      pcVar13 = "there is already an index named %s";
      pTVar12 = zName;
    }
    else {
      if (noErr != 0) {
        sqlite3CodeVerifySchema(pParse,iDb);
        goto LAB_00167245;
      }
      pcVar13 = "table %T already exists";
    }
    sqlite3ErrorMsg(pParse,pcVar13,pTVar12);
  }
  else {
LAB_00167276:
    pTVar8 = (Table *)sqlite3DbMallocZero(db,0x80);
    if (pTVar8 != (Table *)0x0) {
      pTVar8->zName = (char *)zName;
      pTVar8->iPKey = -1;
      pSVar1 = db->aDb[iDb].pSchema;
      pTVar8->pSchema = pSVar1;
      pTVar8->nTabRef = 1;
      pTVar8->nRowLogEst = 200;
      pParse->pNewTable = pTVar8;
      if ((pParse->nested == '\0') && (iVar4 = strcmp((char *)zName,"sqlite_sequence"), iVar4 == 0))
      {
        pSVar1->pSeqTab = pTVar8;
      }
      if (((db->init).busy == '\0') && (p = sqlite3GetVdbe(pParse), p != (Vdbe *)0x0)) {
        sqlite3BeginWriteOperation(pParse,1,iDb);
        if (isVirtual != 0) {
          sqlite3VdbeAddOp3(p,0xa1,0,0,0);
        }
        iVar14 = pParse->nMem;
        iVar4 = iVar14 + 1;
        pParse->regRowid = iVar4;
        iVar6 = iVar14 + 2;
        pParse->regRoot = iVar6;
        iVar14 = iVar14 + 3;
        pParse->nMem = iVar14;
        sqlite3VdbeAddOp3(p,0x69,iDb,iVar14,2);
        sqlite3VdbeUsesBtree(p,iDb);
        iVar5 = sqlite3VdbeAddOp3(p,0x12,iVar14,0,0);
        sqlite3VdbeAddOp3(p,0x6b,iDb,2,(uint)((db->flags & 2) == 0) * 3 + 1);
        sqlite3VdbeAddOp3(p,0x6b,iDb,5,(uint)db->enc);
        if (p->db->mallocFailed == '\0') {
          iVar10 = p->nOp + -1;
          if (-1 < iVar5) {
            iVar10 = iVar5;
          }
          pOVar11 = p->aOp + iVar10;
        }
        else {
          pOVar11 = (Op *)&sqlite3VdbeGetOp_dummy;
        }
        pOVar11->p2 = p->nOp;
        if (isVirtual == 0 && isView == 0) {
          iVar6 = sqlite3VdbeAddOp3(p,0x8c,iDb,iVar6,1);
          pParse->addrCrTab = iVar6;
        }
        else {
          sqlite3VdbeAddOp3(p,0x46,0,iVar6,0);
        }
        sqlite3OpenMasterTable(pParse,iDb);
        sqlite3VdbeAddOp3(p,0x79,0,iVar4,0);
        iVar6 = sqlite3VdbeAddOp3(p,0x4b,6,iVar14,0);
        sqlite3VdbeChangeP4(p,iVar6,"\x06",-1);
        sqlite3VdbeAddOp3(p,0x7a,0,iVar14,iVar4);
        if (0 < (long)p->nOp) {
          p->aOp[(long)p->nOp + -1].p5 = 8;
        }
        sqlite3VdbeAddOp3(p,0x75,0,0,0);
        return;
      }
      return;
    }
    pParse->rc = 7;
    pParse->nErr = pParse->nErr + 1;
  }
LAB_00167245:
  sqlite3DbFreeNN(db,zName);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3StartTable(
  Parse *pParse,   /* Parser context */
  Token *pName1,   /* First part of the name of the table or view */
  Token *pName2,   /* Second part of the name of the table or view */
  int isTemp,      /* True if this is a TEMP table */
  int isView,      /* True if this is a VIEW */
  int isVirtual,   /* True if this is a VIRTUAL table */
  int noErr        /* Do nothing if table already exists */
){
  Table *pTable;
  char *zName = 0; /* The name of the new table */
  sqlite3 *db = pParse->db;
  Vdbe *v;
  int iDb;         /* Database number to create the table in */
  Token *pName;    /* Unqualified name of the table to create */

  if( db->init.busy && db->init.newTnum==1 ){
    /* Special case:  Parsing the sqlite_master or sqlite_temp_master schema */
    iDb = db->init.iDb;
    zName = sqlite3DbStrDup(db, SCHEMA_TABLE(iDb));
    pName = pName1;
  }else{
    /* The common case */
    iDb = sqlite3TwoPartName(pParse, pName1, pName2, &pName);
    if( iDb<0 ) return;
    if( !OMIT_TEMPDB && isTemp && pName2->n>0 && iDb!=1 ){
      /* If creating a temp table, the name may not be qualified. Unless 
      ** the database name is "temp" anyway.  */
      sqlite3ErrorMsg(pParse, "temporary table name must be unqualified");
      return;
    }
    if( !OMIT_TEMPDB && isTemp ) iDb = 1;
    zName = sqlite3NameFromToken(db, pName);
    if( IN_RENAME_OBJECT ){
      sqlite3RenameTokenMap(pParse, (void*)zName, pName);
    }
  }
  pParse->sNameToken = *pName;
  if( zName==0 ) return;
  if( SQLITE_OK!=sqlite3CheckObjectName(pParse, zName) ){
    goto begin_table_error;
  }
  if( db->init.iDb==1 ) isTemp = 1;
#ifndef SQLITE_OMIT_AUTHORIZATION
  assert( isTemp==0 || isTemp==1 );
  assert( isView==0 || isView==1 );
  {
    static const u8 aCode[] = {
       SQLITE_CREATE_TABLE,
       SQLITE_CREATE_TEMP_TABLE,
       SQLITE_CREATE_VIEW,
       SQLITE_CREATE_TEMP_VIEW
    };
    char *zDb = db->aDb[iDb].zDbSName;
    if( sqlite3AuthCheck(pParse, SQLITE_INSERT, SCHEMA_TABLE(isTemp), 0, zDb) ){
      goto begin_table_error;
    }
    if( !isVirtual && sqlite3AuthCheck(pParse, (int)aCode[isTemp+2*isView],
                                       zName, 0, zDb) ){
      goto begin_table_error;
    }
  }
#endif

  /* Make sure the new table name does not collide with an existing
  ** index or table name in the same database.  Issue an error message if
  ** it does. The exception is if the statement being parsed was passed
  ** to an sqlite3_declare_vtab() call. In that case only the column names
  ** and types will be used, so there is no need to test for namespace
  ** collisions.
  */
  if( !IN_SPECIAL_PARSE ){
    char *zDb = db->aDb[iDb].zDbSName;
    if( SQLITE_OK!=sqlite3ReadSchema(pParse) ){
      goto begin_table_error;
    }
    pTable = sqlite3FindTable(db, zName, zDb);
    if( pTable ){
      if( !noErr ){
        sqlite3ErrorMsg(pParse, "table %T already exists", pName);
      }else{
        assert( !db->init.busy || CORRUPT_DB );
        sqlite3CodeVerifySchema(pParse, iDb);
      }
      goto begin_table_error;
    }
    if( sqlite3FindIndex(db, zName, zDb)!=0 ){
      sqlite3ErrorMsg(pParse, "there is already an index named %s", zName);
      goto begin_table_error;
    }
  }

  pTable = sqlite3DbMallocZero(db, sizeof(Table));
  if( pTable==0 ){
    assert( db->mallocFailed );
    pParse->rc = SQLITE_NOMEM_BKPT;
    pParse->nErr++;
    goto begin_table_error;
  }
  pTable->zName = zName;
  pTable->iPKey = -1;
  pTable->pSchema = db->aDb[iDb].pSchema;
  pTable->nTabRef = 1;
#ifdef SQLITE_DEFAULT_ROWEST
  pTable->nRowLogEst = sqlite3LogEst(SQLITE_DEFAULT_ROWEST);
#else
  pTable->nRowLogEst = 200; assert( 200==sqlite3LogEst(1048576) );
#endif
  assert( pParse->pNewTable==0 );
  pParse->pNewTable = pTable;

  /* If this is the magic sqlite_sequence table used by autoincrement,
  ** then record a pointer to this table in the main database structure
  ** so that INSERT can find the table easily.
  */
#ifndef SQLITE_OMIT_AUTOINCREMENT
  if( !pParse->nested && strcmp(zName, "sqlite_sequence")==0 ){
    assert( sqlite3SchemaMutexHeld(db, iDb, 0) );
    pTable->pSchema->pSeqTab = pTable;
  }
#endif

  /* Begin generating the code that will insert the table record into
  ** the SQLITE_MASTER table.  Note in particular that we must go ahead
  ** and allocate the record number for the table entry now.  Before any
  ** PRIMARY KEY or UNIQUE keywords are parsed.  Those keywords will cause
  ** indices to be created and the table record must come before the 
  ** indices.  Hence, the record number for the table must be allocated
  ** now.
  */
  if( !db->init.busy && (v = sqlite3GetVdbe(pParse))!=0 ){
    int addr1;
    int fileFormat;
    int reg1, reg2, reg3;
    /* nullRow[] is an OP_Record encoding of a row containing 5 NULLs */
    static const char nullRow[] = { 6, 0, 0, 0, 0, 0 };
    sqlite3BeginWriteOperation(pParse, 1, iDb);

#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( isVirtual ){
      sqlite3VdbeAddOp0(v, OP_VBegin);
    }
#endif

    /* If the file format and encoding in the database have not been set, 
    ** set them now.
    */
    reg1 = pParse->regRowid = ++pParse->nMem;
    reg2 = pParse->regRoot = ++pParse->nMem;
    reg3 = ++pParse->nMem;
    sqlite3VdbeAddOp3(v, OP_ReadCookie, iDb, reg3, BTREE_FILE_FORMAT);
    sqlite3VdbeUsesBtree(v, iDb);
    addr1 = sqlite3VdbeAddOp1(v, OP_If, reg3); VdbeCoverage(v);
    fileFormat = (db->flags & SQLITE_LegacyFileFmt)!=0 ?
                  1 : SQLITE_MAX_FILE_FORMAT;
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_FILE_FORMAT, fileFormat);
    sqlite3VdbeAddOp3(v, OP_SetCookie, iDb, BTREE_TEXT_ENCODING, ENC(db));
    sqlite3VdbeJumpHere(v, addr1);

    /* This just creates a place-holder record in the sqlite_master table.
    ** The record created does not contain anything yet.  It will be replaced
    ** by the real entry in code generated at sqlite3EndTable().
    **
    ** The rowid for the new entry is left in register pParse->regRowid.
    ** The root page number of the new table is left in reg pParse->regRoot.
    ** The rowid and root page number values are needed by the code that
    ** sqlite3EndTable will generate.
    */
#if !defined(SQLITE_OMIT_VIEW) || !defined(SQLITE_OMIT_VIRTUALTABLE)
    if( isView || isVirtual ){
      sqlite3VdbeAddOp2(v, OP_Integer, 0, reg2);
    }else
#endif
    {
      pParse->addrCrTab =
         sqlite3VdbeAddOp3(v, OP_CreateBtree, iDb, reg2, BTREE_INTKEY);
    }
    sqlite3OpenMasterTable(pParse, iDb);
    sqlite3VdbeAddOp2(v, OP_NewRowid, 0, reg1);
    sqlite3VdbeAddOp4(v, OP_Blob, 6, reg3, 0, nullRow, P4_STATIC);
    sqlite3VdbeAddOp3(v, OP_Insert, 0, reg3, reg1);
    sqlite3VdbeChangeP5(v, OPFLAG_APPEND);
    sqlite3VdbeAddOp0(v, OP_Close);
  }

  /* Normal (non-error) return. */
  return;

  /* If an error occurs, we jump here */
begin_table_error:
  sqlite3DbFree(db, zName);
  return;
}